

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall
leveldb::DBImpl::RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::
LogReporter::Corruption(unsigned_long,leveldb::Status_const__(void *this,size_t bytes,Status *s)

{
  Logger *info_log;
  undefined8 uVar1;
  Status *this_00;
  char *pcVar2;
  long in_FS_OFFSET;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = "";
  if (*(long *)((long)this + 0x20) == 0) {
    pcVar2 = "(ignoring error) ";
  }
  info_log = *(Logger **)((long)this + 0x10);
  uVar1 = *(undefined8 *)((long)this + 0x18);
  Status::ToString_abi_cxx11_(&local_58,s);
  Log(info_log,"%s%s: dropping %d bytes; %s",pcVar2,uVar1,bytes & 0xffffffff,
      local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = *(Status **)((long)this + 0x20);
  if ((this_00 != (Status *)0x0) && (this_00->state_ == (char *)0x0)) {
    Status::operator=(this_00,s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }